

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O2

ConstStridedValueAccess<64> __thiscall
rsg::ConstStridedValueAccess<64>::member(ConstStridedValueAccess<64> *this,int memberNdx)

{
  Scalar *pSVar1;
  VariableType *pVVar2;
  int iVar3;
  ConstStridedValueAccess<64> CVar4;
  
  pSVar1 = this->m_value;
  pVVar2 = (this->m_type->m_members).
           super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
           ._M_impl.super__Vector_impl_data._M_start[memberNdx].m_type;
  iVar3 = VariableType::getMemberScalarOffset(this->m_type,memberNdx);
  CVar4.m_value = pSVar1 + (iVar3 << 6);
  CVar4.m_type = pVVar2;
  return CVar4;
}

Assistant:

ConstStridedValueAccess		member					(int memberNdx) const	{ return ConstStridedValueAccess(getType().getMembers()[memberNdx].getType(), m_value + Stride*getType().getMemberScalarOffset(memberNdx));	}